

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O1

ssh_keyalg * pubkey_blob_to_alg(ptrlen blob)

{
  ssh_keyalg *psVar1;
  _Bool _Var2;
  long lVar3;
  ptrlen pl;
  BinarySource src [1];
  BinarySource local_58;
  
  local_58.len = blob.len;
  local_58.data = blob.ptr;
  local_58.binarysource_ = &local_58;
  local_58.pos = 0;
  local_58.err = BSE_NO_ERROR;
  pl = BinarySource_get_string(&local_58);
  lVar3 = 0;
  do {
    psVar1 = *(ssh_keyalg **)((long)all_keyalgs + lVar3);
    _Var2 = ptrlen_eq_string(pl,psVar1->ssh_id);
    if (_Var2) {
      return psVar1;
    }
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x88);
  return (ssh_keyalg *)0x0;
}

Assistant:

const ssh_keyalg *pubkey_blob_to_alg(ptrlen blob)
{
    return find_pubkey_alg_len(pubkey_blob_to_alg_name(blob));
}